

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_>::cleanup
          (SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_> *this,
          EVP_PKEY_CTX *ctx)

{
  std::ranges::__destroy_fn::
  operator()<slang::SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_>_&>
            ((__destroy_fn *)&std::ranges::destroy,this);
  if (this->data_ != (pointer)this->firstElement) {
    operator_delete(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }